

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O0

void duckdb_re2::AppendCCRange(string *t,Rune lo,Rune hi)

{
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  Rune in_stack_0000004c;
  string *in_stack_00000050;
  
  if ((in_ESI <= in_EDX) && (AppendCCChar(in_stack_00000050,in_stack_0000004c), in_ESI < in_EDX)) {
    std::__cxx11::string::append(in_RDI);
    AppendCCChar(in_stack_00000050,in_stack_0000004c);
  }
  return;
}

Assistant:

static void AppendCCRange(std::string* t, Rune lo, Rune hi) {
  if (lo > hi)
    return;
  AppendCCChar(t, lo);
  if (lo < hi) {
    t->append("-");
    AppendCCChar(t, hi);
  }
}